

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

float ggml_get_f32_1d(ggml_tensor *tensor,int i)

{
  ulong uVar1;
  int in_ESI;
  undefined4 *in_RDI;
  int64_t id [4];
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined1 local_20 [12];
  int local_14;
  undefined4 *local_10;
  float local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar1 = ggml_is_contiguous(in_RDI);
  if ((uVar1 & 1) == 0) {
    memset(&stack0xffffffffffffffc8,0,0x20);
    ggml_unravel_index(local_10,(long)local_14,&stack0xffffffffffffffc8,&stack0xffffffffffffffd0,
                       &stack0xffffffffffffffd8,local_20);
    local_4 = ggml_get_f32_nd(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                              in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                              in_stack_ffffffffffffffc8);
  }
  else {
    switch(*local_10) {
    case 0:
      local_4 = *(float *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 4);
      break;
    case 1:
      local_4 = ggml_lookup_fp16_to_fp32
                          (*(ggml_fp16_t *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 2));
      break;
    default:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x432,"fatal error");
      break;
    case 0x18:
      local_4 = (float)(int)*(char *)(*(long *)(local_10 + 0x3e) + (long)local_14);
      break;
    case 0x19:
      local_4 = (float)(int)*(short *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 2);
      break;
    case 0x1a:
      local_4 = (float)*(int *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 4);
      break;
    case 0x1e:
      local_4 = ggml_compute_bf16_to_fp32
                          ((ggml_bf16_t)
                           *(uint16_t *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 2));
    }
  }
  return local_4;
}

Assistant:

float ggml_get_f32_1d(const struct ggml_tensor * tensor, int i) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        return ggml_get_f32_nd(tensor, id[0], id[1], id[2], id[3]);
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                return ((int8_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I16:
            {
                return ((int16_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I32:
            {
                return ((int32_t *)(tensor->data))[i];
            }
        case GGML_TYPE_F16:
            {
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_BF16:
            {
                return GGML_BF16_TO_FP32(((ggml_bf16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_F32:
            {
                return ((float *)(tensor->data))[i];
            }
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}